

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cc
# Opt level: O0

Status __thiscall
VirtualFileSystem::ReadFile(VirtualFileSystem *this,string *path,string *contents,string *err)

{
  bool bVar1;
  pointer ppVar2;
  char *pcVar3;
  _Self local_40;
  _Self local_38;
  iterator i;
  string *err_local;
  string *contents_local;
  string *path_local;
  VirtualFileSystem *this_local;
  
  i._M_node = (_Base_ptr)err;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->files_read_,path);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry>_>_>
       ::find(&this->files_,path);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry>_>_>
       ::end(&this->files_);
  bVar1 = std::operator!=(&local_38,&local_40);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry>_>
             ::operator->(&local_38);
    std::__cxx11::string::operator=((string *)contents,(string *)&(ppVar2->second).contents);
  }
  else {
    pcVar3 = strerror(2);
    std::__cxx11::string::operator=((string *)i._M_node,pcVar3);
  }
  this_local._4_4_ = (Status)!bVar1;
  return this_local._4_4_;
}

Assistant:

FileReader::Status VirtualFileSystem::ReadFile(const string& path,
                                               string* contents,
                                               string* err) {
  files_read_.push_back(path);
  FileMap::iterator i = files_.find(path);
  if (i != files_.end()) {
    *contents = i->second.contents;
    return Okay;
  }
  *err = strerror(ENOENT);
  return NotFound;
}